

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 context,
          Parameters *param_4)

{
  undefined8 local_7d0;
  RefBase<vk::VkDevice_s_*> local_7c8;
  string local_7a8;
  RefBase<vk::VkDevice_s_*> local_788;
  RefBase<vk::VkDevice_s_*> local_768;
  Environment env;
  RefBase<vk::VkDevice_s_*> local_718;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  
  local_7d0 = context;
  Environment::Environment(&env,(Context *)this,1);
  Device::Resources::Resources(&res0,&env,(Parameters *)&local_7d0);
  Device::Resources::Resources(&res1,&env,(Parameters *)&local_7d0);
  Device::Resources::Resources(&res2,&env,(Parameters *)&local_7d0);
  Device::Resources::Resources(&res3,&env,(Parameters *)&local_7d0);
  Device::create((Move<vk::VkDevice_s_*> *)&local_7c8,&env,&res0,param_4);
  local_7a8.field_2._M_allocated_capacity = (size_type)local_7c8.m_data.deleter.m_allocator;
  local_7a8._M_dataplus._M_p = (pointer)local_7c8.m_data.object;
  local_7a8._M_string_length = (size_type)local_7c8.m_data.deleter.m_destroyDevice;
  local_7c8.m_data.object = (VkDevice_s *)0x0;
  local_7c8.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_7c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_7c8);
  Device::create((Move<vk::VkDevice_s_*> *)&local_788,&env,&res1,param_4);
  local_7c8.m_data.deleter.m_allocator = local_788.m_data.deleter.m_allocator;
  local_7c8.m_data.object = local_788.m_data.object;
  local_7c8.m_data.deleter.m_destroyDevice = local_788.m_data.deleter.m_destroyDevice;
  local_788.m_data.object = (VkDevice_s *)0x0;
  local_788.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_788.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_788);
  Device::create((Move<vk::VkDevice_s_*> *)&local_768,&env,&res2,param_4);
  local_788.m_data.deleter.m_allocator = local_768.m_data.deleter.m_allocator;
  local_788.m_data.object = local_768.m_data.object;
  local_788.m_data.deleter.m_destroyDevice = local_768.m_data.deleter.m_destroyDevice;
  local_768.m_data.object = (VkDevice_s *)0x0;
  local_768.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_768.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_768);
  Device::create((Move<vk::VkDevice_s_*> *)&local_718,&env,&res3,param_4);
  local_768.m_data.deleter.m_allocator = local_718.m_data.deleter.m_allocator;
  local_768.m_data.object = local_718.m_data.object;
  local_768.m_data.deleter.m_destroyDevice = local_718.m_data.deleter.m_destroyDevice;
  local_718.m_data.object = (VkDevice_s *)0x0;
  local_718.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_718.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_718);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_768);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_788);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_7c8);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase((RefBase<vk::VkDevice_s_*> *)&local_7a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"Ok",(allocator<char> *)&local_7c8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_7a8);
  std::__cxx11::string::~string((string *)&local_7a8);
  Device::Resources::~Resources(&res3);
  Device::Resources::~Resources(&res2);
  Device::Resources::~Resources(&res1);
  Device::Resources::~Resources(&res0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}